

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

string * __thiscall
cmCTestP4::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestP4 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_identify;
  string rev;
  string source;
  OutputLogger err;
  IdentifyParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1d8;
  string local_1b8;
  _func_int **local_198 [2];
  _func_int *local_188 [2];
  OutputLogger local_178;
  IdentifyParser local_138;
  
  local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SetP4Options(this,&local_1d8);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5a0cc5;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5a0caa;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5f3c38;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x5a0ccd;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  std::__cxx11::string::append((char *)local_198);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = local_198[0];
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_1d8,(char **)&local_138);
  paVar1 = &local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  IdentifyParser::IdentifyParser(&local_138,this,"p4_changes-out> ",&local_1b8);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_178,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"p4_changes-err> ");
  bVar3 = cmCTestVC::RunChild((cmCTestVC *)this,
                              local_1d8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_138,
                              (OutputParser *)&local_178,(char *)0x0,Auto);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1b8._M_string_length == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"0","");
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                      local_1b8.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1b8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_1b8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                      local_1b8.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_1b8._M_string_length;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_local_buf[0] = '\0';
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"<unknown>","")
    ;
  }
  local_178.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00717c80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.super_LineParser.Line._M_dataplus._M_p !=
      &local_178.super_LineParser.Line.field_2) {
    operator_delete(local_178.super_LineParser.Line._M_dataplus._M_p,
                    local_178.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__IdentifyParser_007163c8;
  if (local_138.RegexIdentify.program != (char *)0x0) {
    operator_delete__(local_138.RegexIdentify.program);
  }
  local_138.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00717c80;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.super_LineParser.Line._M_dataplus._M_p !=
      &local_138.super_LineParser.Line.field_2) {
    operator_delete(local_138.super_LineParser.Line._M_dataplus._M_p,
                    local_138.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,
                    CONCAT71(local_1b8.field_2._M_allocated_capacity._1_7_,
                             local_1b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],(ulong)(local_188[0] + 1));
  }
  if (local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestP4::GetWorkingRevision()
{
  std::vector<char const*> p4_identify;
  SetP4Options(p4_identify);

  p4_identify.push_back("changes");
  p4_identify.push_back("-m");
  p4_identify.push_back("1");
  p4_identify.push_back("-t");

  std::string source = this->SourceDirectory + "/...#have";
  p4_identify.push_back(source.c_str());
  p4_identify.push_back(nullptr);

  std::string rev;
  IdentifyParser out(this, "p4_changes-out> ", rev);
  OutputLogger err(this->Log, "p4_changes-err> ");

  bool result = RunChild(&p4_identify[0], &out, &err);

  // If there was a problem contacting the server return "<unknown>"
  if (!result) {
    return "<unknown>";
  }

  if (rev.empty()) {
    return "0";
  }
  return rev;
}